

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::SizeRange::MergeFrom(SizeRange *this,SizeRange *from)

{
  LogMessage *other;
  uint64_t uVar1;
  int64_t iVar2;
  LogFinisher local_65;
  uint32_t cached_has_bits;
  byte local_51;
  LogMessage local_50;
  SizeRange *local_18;
  SizeRange *from_local;
  SizeRange *this_local;
  
  local_51 = 0;
  local_18 = from;
  from_local = this;
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O0/mlmodel/format/FeatureTypes.pb.cc"
               ,0x3cd);
    local_51 = 1;
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_65,other);
  }
  if ((local_51 & 1) != 0) {
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  uVar1 = _internal_lowerbound(local_18);
  if (uVar1 != 0) {
    uVar1 = _internal_lowerbound(local_18);
    _internal_set_lowerbound(this,uVar1);
  }
  iVar2 = _internal_upperbound(local_18);
  if (iVar2 != 0) {
    iVar2 = _internal_upperbound(local_18);
    _internal_set_upperbound(this,iVar2);
  }
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(local_18->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void SizeRange::MergeFrom(const SizeRange& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.SizeRange)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  if (from._internal_lowerbound() != 0) {
    _internal_set_lowerbound(from._internal_lowerbound());
  }
  if (from._internal_upperbound() != 0) {
    _internal_set_upperbound(from._internal_upperbound());
  }
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}